

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<long>::RepeatedField
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->current_size_ != 0) {
    Reserve(this,other->current_size_);
    this->current_size_ = this->current_size_ + other->current_size_;
    memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 3);
    return;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}